

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

void __thiscall Js::JavascriptMap::SetOnEmptyMap(JavascriptMap *this,Var key,Var value)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Recycler *pRVar6;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined1 local_90 [8];
  MapDataKeyValuePair complexPair;
  WriteBarrierPtr<void> local_68;
  WriteBarrierPtr<void> local_60;
  WriteBarrierPtr<void> local_58;
  WriteBarrierPtr<void> local_50;
  Var local_48;
  Var key_local;
  Var simpleVar;
  MapDataNode *node;
  
  local_48 = key;
  if (this->kind != EmptyMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x1fc,"(this->kind == MapKind::EmptyMap)",
                                "this->kind == MapKind::EmptyMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(key);
  key_local = pvVar5;
  pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  if (pvVar5 == (Var)0x0) {
    local_90 = (undefined1  [8])
               &JsUtil::
                BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    complexPair.key.ptr = (void *)0x0;
    complexPair.value.ptr = &DAT_ffffffffffffffff;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_90);
    this_01 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,pRVar6,0x387914);
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_01,pRVar6,0);
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58.ptr = key;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50.ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_90,&local_58,&local_50);
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    simpleVar = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                ::Append(&this->list,
                         (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                          *)local_90,pRVar6);
    JsUtil::
    BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_01,&local_48,
               (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                **)&simpleVar);
    Memory::Recycler::WBSetBit((char *)&(this->u).simpleVarMap);
    *(BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      **)&(this->u).simpleVarMap = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
    TVar3 = ComplexVarMap;
  }
  else {
    local_90 = (undefined1  [8])
               &JsUtil::
                BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    complexPair.key.ptr = (void *)0x0;
    complexPair.value.ptr = &DAT_ffffffffffffffff;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_90);
    this_00 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,pRVar6,0x387914);
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,pRVar6,0);
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68.ptr = pvVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60.ptr = value;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_90,&local_68,&local_60);
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    simpleVar = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                ::Append(&this->list,
                         (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                          *)local_90,pRVar6);
    JsUtil::
    BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,&key_local,
               (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                **)&simpleVar);
    Memory::Recycler::WBSetBit((char *)&(this->u).simpleVarMap);
    *(BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      **)&(this->u).simpleVarMap = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
    TVar3 = SimpleVarMap;
  }
  this->kind = TVar3;
  return;
}

Assistant:

void
JavascriptMap::SetOnEmptyMap(Var key, Var value)
{
    Assert(this->kind == MapKind::EmptyMap);
    Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(key);
    if (simpleVar)
    {
        SimpleVarDataMap* newSimpleMap = RecyclerNew(this->GetRecycler(), SimpleVarDataMap, this->GetRecycler());
        MapDataKeyValuePair simplePair(simpleVar, value);

        MapDataNode* node = this->list.Append(simplePair, this->GetRecycler());

        newSimpleMap->Add(simpleVar, node);

        this->u.simpleVarMap = newSimpleMap;
        this->kind = MapKind::SimpleVarMap;
        return;
    }

    ComplexVarDataMap* newComplexSet = RecyclerNew(this->GetRecycler(), ComplexVarDataMap, this->GetRecycler());
    MapDataKeyValuePair complexPair(key, value);

    MapDataNode* node = this->list.Append(complexPair, this->GetRecycler());

    newComplexSet->Add(key, node);

    this->u.complexVarMap = newComplexSet;
    this->kind = MapKind::ComplexVarMap;
}